

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

float __thiscall
anon_unknown.dwarf_5f851::MapDriver::scanObstacleMap
          (MapDriver *this,Vec3 *start,Vec3 *center,float arcAngle,int segments,
          float endRadiusChange,Color *beforeColor,Color *afterColor,Vec3 *returnObstaclePosition)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Color *color;
  int iVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_a8;
  float local_a4;
  Vec3 local_a0;
  float local_94;
  float local_90;
  float local_8c;
  Vec3 local_88;
  float local_7c;
  float local_78;
  float local_74;
  Color *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Color *local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar1 = start->x;
  uVar4 = start->y;
  uVar2 = center->x;
  uVar5 = center->y;
  fVar11 = (float)uVar1 - (float)uVar2;
  fVar13 = (float)uVar4 - (float)uVar5;
  local_8c = start->z - center->z;
  fVar10 = OpenSteer::Vec3::zero.y;
  returnObstaclePosition->x = OpenSteer::Vec3::zero.x;
  returnObstaclePosition->y = fVar10;
  returnObstaclePosition->z = OpenSteer::Vec3::zero.z;
  fVar10 = 0.0;
  local_a8 = 0.0;
  local_68 = CONCAT44(fVar13,fVar11);
  uStack_60 = 0;
  local_90 = endRadiusChange;
  local_70 = beforeColor;
  local_50 = afterColor;
  if ((endRadiusChange != 0.0) || (NAN(endRadiusChange))) {
    fVar10 = local_8c * local_8c + fVar11 * fVar11 + fVar13 * fVar13;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
  }
  local_88.z = start->z;
  local_88.x = start->x;
  local_88.y = start->y;
  if (0 < segments) {
    local_78 = (float)segments;
    fVar11 = arcAngle / local_78;
    fVar13 = fVar10 + local_90;
    if (fVar13 <= 0.0) {
      fVar13 = 0.0;
    }
    local_7c = fVar13 / fVar10 + -1.0;
    bVar8 = false;
    local_a8 = 0.0;
    local_a4 = 0.0;
    fVar10 = 0.0;
    iVar7 = 1;
    do {
      if ((((local_a4 == 0.0) && (!NAN(local_a4))) && (fVar10 == 0.0)) && (!NAN(fVar10))) {
        local_a4 = sinf(fVar11);
        fVar10 = cosf(fVar11);
      }
      fVar13 = 1.0;
      if ((local_90 != 0.0) || (NAN(local_90))) {
        fVar13 = ((float)iVar7 / local_78) * local_7c + 1.0;
      }
      fVar14 = (float)local_68 * fVar10 + local_8c * local_a4;
      local_8c = local_8c * fVar10 - local_a4 * (float)local_68;
      uVar3 = center->x;
      uVar6 = center->y;
      local_a0.z = local_8c * fVar13 + center->z;
      fVar12 = (float)uVar3 + fVar13 * fVar14;
      fVar13 = (float)uVar6 + fVar13 * local_68._4_4_;
      local_a0.y = fVar13;
      local_a0.x = fVar12;
      color = local_50;
      local_74 = fVar10;
      if (!bVar8) {
        fStack_44 = local_68._4_4_;
        uStack_40 = (undefined4)uStack_60;
        uStack_3c = uStack_60._4_4_;
        fVar12 = fVar12 - local_88.x;
        fVar13 = fVar13 - local_88.y;
        fVar10 = (local_a0.z - local_88.z) * (local_a0.z - local_88.z) +
                 fVar12 * fVar12 + fVar13 * fVar13;
        local_48 = fVar14;
        if (fVar10 < 0.0) {
          local_94 = sqrtf(fVar10);
        }
        else {
          local_94 = SQRT(fVar10);
        }
        bVar9 = TerrainMap::getMapValue(this->map,&local_a0);
        color = local_70;
        fVar14 = local_48;
        if (bVar9) {
          local_a8 = (float)iVar7 * (local_94 + local_94) * 0.5;
          returnObstaclePosition->x = local_a0.x;
          returnObstaclePosition->y = local_a0.y;
          returnObstaclePosition->z = local_a0.z;
          bVar8 = true;
        }
      }
      local_68 = CONCAT44(local_68._4_4_,fVar14);
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_88,&local_a0,color);
      local_88.x = local_a0.x;
      local_88.y = local_a0.y;
      local_88.z = local_a0.z;
      bVar9 = iVar7 != segments;
      fVar10 = local_74;
      iVar7 = iVar7 + 1;
    } while (bVar9);
  }
  return local_a8;
}

Assistant:

float scanObstacleMap (const Vec3& start,
                               const Vec3& center,
                               const float arcAngle,
                               const int segments,
                               const float endRadiusChange,
                               const Color& beforeColor,
                               const Color& afterColor,
                               Vec3& returnObstaclePosition)
        {
            // "spoke" is initially the vector from center to start,
            // which is then rotated step by step around center
            Vec3 spoke = start - center;
            // determine the angular step per segment
            const float step = arcAngle / segments;
            // store distance to, and position of first obstacle
            float obstacleDistance = 0;
            returnObstaclePosition = Vec3::zero;
            // for spiral "ramps" of changing radius
            const float startRadius = (endRadiusChange == 0) ? 0 : spoke.length(); 

            // traverse each segment along arc
            float sin=0, cos=0;
            Vec3 oldPoint = start;
            bool obstacleFound = false;
            for (int i = 0; i < segments; i++)
            {
                // rotate "spoke" to next step around circle
                // (sin and cos values get filled in on first call)
                spoke = spoke.rotateAboutGlobalY (step, sin, cos);

                // for spiral "ramps" of changing radius
                const float adjust = ((endRadiusChange == 0) ?
                                      1.0f :
                                      interpolate ((float)(i+1) / (float)segments,
                                                   1.0f,
                                                   (maxXXX (0,
                                                            (startRadius +
                                                             endRadiusChange))
                                                    / startRadius)));

                // construct new scan point: center point, offset by rotated
                // spoke (possibly adjusting the radius if endRadiusChange!=0)
                const Vec3 newPoint = center + (spoke * adjust);

                // once an obstacle if found "our work here is done" -- continue
                // to loop only for the sake of annotation (make that optional?)
                if (obstacleFound)
                {
                    annotationLine (oldPoint, newPoint, afterColor);
                }
                else
                {
                    // no obstacle found on this scan so far,
                    // scan map along current segment (a chord of the arc)
                    const Vec3 offset = newPoint - oldPoint;
                    const float d2 = offset.length() * 2;

                    // when obstacle found: set flag, save distance and position
                    if (! map->isPassable (newPoint))
                    {
                        obstacleFound = true;
                        obstacleDistance = d2 * 0.5f * (i+1);
                        returnObstaclePosition = newPoint;
                    }
                    annotationLine (oldPoint, newPoint, beforeColor);
                }
                // save new point for next time around loop
                oldPoint = newPoint;
            }
            // return distance to first obstacle (or zero if none found)
            return obstacleDistance;
        }